

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

int __thiscall
FOptionMenuItemStaticTextSwitchable::Draw
          (FOptionMenuItemStaticTextSwitchable *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  int iVar1;
  BYTE *string;
  
  string = (BYTE *)(&(this->super_FOptionMenuItem).mLabel)[(ulong)(this->mCurrent != 0) * 2].Chars;
  if (*string == '$') {
    string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
  }
  iVar1 = FFont::StringWidth(SmallFont,string);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,*(int *)&(this->super_FOptionMenuItem).field_0x24,
                    ((screen->super_DSimpleCanvas).super_DCanvas.Width - iVar1 * CleanXfac_1) / 2,y,
                    (char *)string,0x40001394,1,0);
  return -1;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		const char *txt = mCurrent? mAltText.GetChars() : mLabel.GetChars();
		if (*txt == '$') txt = GStrings(txt + 1);
		int w = SmallFont->StringWidth(txt) * CleanXfac_1;
		int x = (screen->GetWidth() - w) / 2;
		screen->DrawText (SmallFont, mColor, x, y, txt, DTA_CleanNoMove_1, true, TAG_DONE);
		return -1;
	}